

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracerConfig.cpp
# Opt level: O2

ostream * operator<<(ostream *out,RayTracerConfig *config)

{
  pointer pSVar1;
  pointer pPVar2;
  pointer pTVar3;
  ostream *poVar4;
  Sphere *sphere;
  pointer sphere_00;
  pointer plane;
  pointer triangle;
  
  poVar4 = std::operator<<(out,"antiAliasing: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(config->super_BaseConfig).antiAliasing);
  poVar4 = std::operator<<(poVar4,"\nmaxRecursionLevel: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(config->super_BaseConfig).maxRecursionLevel);
  poVar4 = std::operator<<(poVar4,"\nambientCoefficient: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(config->super_BaseConfig).ambientCoefficient)
  ;
  poVar4 = std::operator<<(poVar4,"\nimageX: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(config->super_BaseConfig).imageX);
  poVar4 = std::operator<<(poVar4,"\nimageY: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(config->super_BaseConfig).imageY);
  poVar4 = std::operator<<(poVar4,"\nimageZ: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(config->super_BaseConfig).imageZ);
  poVar4 = std::operator<<(poVar4,"\nobserver: ");
  poVar4 = operator<<(poVar4,&(config->super_BaseConfig).observer);
  poVar4 = std::operator<<(poVar4,"\nlight: ");
  operator<<(poVar4,&(config->super_BaseConfig).light);
  std::operator<<(out,"\nspheres:\n");
  pSVar1 = (config->spheres).super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (sphere_00 = (config->spheres).super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                   super__Vector_impl_data._M_start; sphere_00 != pSVar1; sphere_00 = sphere_00 + 1)
  {
    poVar4 = operator<<(out,sphere_00);
    std::operator<<(poVar4,'\n');
  }
  std::operator<<(out,"planes:\n");
  pPVar2 = (config->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (plane = (config->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
               super__Vector_impl_data._M_start; plane != pPVar2; plane = plane + 1) {
    poVar4 = operator<<(out,plane);
    std::operator<<(poVar4,'\n');
  }
  std::operator<<(out,"planes:\n");
  pTVar3 = (config->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (triangle = (config->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                  _M_impl.super__Vector_impl_data._M_start; triangle != pTVar3;
      triangle = triangle + 1) {
    poVar4 = operator<<(out,triangle);
    std::operator<<(poVar4,'\n');
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, RayTracerConfig const& config)
{
  out << "antiAliasing: " << config.antiAliasing
      << "\nmaxRecursionLevel: " << config.maxRecursionLevel
      << "\nambientCoefficient: " << config.ambientCoefficient << "\nimageX: " << config.imageX
      << "\nimageY: " << config.imageY << "\nimageZ: " << config.imageZ
      << "\nobserver: " << config.observer << "\nlight: " << config.light;
  out << "\nspheres:\n";
  for (Sphere const& sphere : config.spheres)
    out << sphere << '\n';
  out << "planes:\n";
  for (Plane const& plane : config.planes)
    out << plane << '\n';
  out << "planes:\n";
  for (Triangle const& triangle : config.triangles)
    out << triangle << '\n';
  return out;
}